

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqrtf.h
# Opt level: O3

float sqrtf_2(float x)

{
  float fVar1;
  
  fVar1 = (float)(((int)x >> 1) + 0x1fc00000);
  fVar1 = x / fVar1 + fVar1;
  return fVar1 * 0.25 + x / fVar1;
}

Assistant:

float sqrtf_2(const float x)
{
    union
    {
        int i;
        float x;
    } u;
    u.x = x;
    u.i = (1 << 29) + (u.i >> 1) - (1 << 22);
    // Two Babylonian Steps (simplified from:)
    // u.x = 0.5f * (u.x + x/u.x);
    // u.x = 0.5f * (u.x + x/u.x);
    u.x = u.x + x / u.x;
    u.x = 0.25 * u.x + x / u.x;
    return u.x;
}